

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Bitmap.cxx
# Opt level: O3

int __thiscall Fl_Bitmap::copy(Fl_Bitmap *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  uchar *puVar2;
  uint uVar3;
  uint uVar4;
  _func_int **pp_Var5;
  Fl_Image *this_00;
  int iVar6;
  int iVar7;
  int iVar8;
  int W;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  int H;
  int iVar15;
  
  W = (int)dst;
  iVar6 = (this->super_Fl_Image).w_;
  iVar1 = (this->super_Fl_Image).h_;
  H = (int)src;
  if (iVar1 == H && iVar6 == W) {
    iVar6 = W + 0xe;
    if (-1 < W + 7) {
      iVar6 = W + 7;
    }
    uVar14 = (ulong)((iVar6 >> 3) * H);
    pp_Var5 = (_func_int **)operator_new__(uVar14);
    memcpy(pp_Var5,this->array,uVar14);
    this_00 = (Fl_Image *)operator_new(0x38);
    Fl_Image::Fl_Image(this_00,W,H,0);
    this_00->_vptr_Fl_Image = (_func_int **)&PTR__Fl_Bitmap_00276670;
    this_00[1]._vptr_Fl_Image = pp_Var5;
    this_00->data_ = (char **)(this_00 + 1);
    this_00->count_ = 1;
    this_00[1].w_ = 1;
    this_00[1].h_ = 0;
  }
  else if (H < 1 || W < 1) {
    this_00 = (Fl_Image *)0x0;
  }
  else {
    uVar14 = (ulong)((W + 7U >> 3) * H);
    pp_Var5 = (_func_int **)operator_new__(uVar14);
    this_00 = (Fl_Image *)operator_new(0x38);
    iVar8 = 0;
    Fl_Image::Fl_Image(this_00,W,H,0);
    this_00->_vptr_Fl_Image = (_func_int **)&PTR__Fl_Bitmap_00276670;
    this_00[1]._vptr_Fl_Image = pp_Var5;
    this_00->data_ = (char **)(this_00 + 1);
    this_00->count_ = 1;
    this_00[1].w_ = 1;
    this_00[1].h_ = 0;
    memset(pp_Var5,0,uVar14);
    uVar14 = (ulong)src & 0xffffffff;
    uVar9 = (ulong)src & 0xffffffff;
    do {
      iVar7 = (this->super_Fl_Image).w_;
      iVar11 = iVar7 + 7;
      iVar7 = iVar7 + 0xe;
      if (-1 < iVar11) {
        iVar7 = iVar11;
      }
      puVar2 = this->array;
      uVar10 = 1;
      uVar4 = 0;
      uVar13 = (ulong)dst & 0xffffffff;
      iVar11 = W + 1;
      do {
        uVar3 = uVar4 + 7;
        if (-1 < (int)uVar4) {
          uVar3 = uVar4;
        }
        if ((puVar2[(long)((int)uVar3 >> 3) + (long)((iVar7 >> 3) * iVar8)] >> (uVar4 & 7) & 1) != 0
           ) {
          *(byte *)pp_Var5 = *(byte *)pp_Var5 | (byte)uVar10;
        }
        pp_Var5 = (_func_int **)((long)pp_Var5 + (uVar10 >> 7));
        uVar3 = (int)uVar10 * 2 & 0xff;
        if ((char)(byte)uVar10 < '\0') {
          uVar3 = 1;
        }
        uVar10 = (ulong)uVar3;
        iVar12 = (int)uVar13 - iVar6 % W;
        iVar15 = 0;
        if (iVar12 < 1) {
          iVar15 = W;
        }
        uVar4 = (uint)(iVar12 < 1) + uVar4 + iVar6 / W;
        uVar13 = (ulong)(uint)(iVar12 + iVar15);
        iVar11 = iVar11 + -1;
      } while (1 < iVar11);
      pp_Var5 = (_func_int **)((long)pp_Var5 + (ulong)(1 < (byte)uVar3));
      iVar7 = (int)uVar14 - iVar1 % H;
      iVar11 = 0;
      if (iVar7 < 1) {
        iVar11 = H;
      }
      iVar8 = iVar8 + iVar1 / H + (uint)(iVar7 < 1);
      uVar14 = (ulong)(uint)(iVar7 + iVar11);
      iVar11 = (int)uVar9;
      uVar9 = (ulong)(iVar11 - 1);
    } while (1 < iVar11);
  }
  return (int)this_00;
}

Assistant:

Fl_Image *Fl_Bitmap::copy(int W, int H) {
  Fl_Bitmap	*new_image;	// New RGB image
  uchar		*new_array;	// New array for image data

  // Optimize the simple copy where the width and height are the same...
  if (W == w() && H == h()) {
    new_array = new uchar [H * ((W + 7) / 8)];
    memcpy(new_array, array, H * ((W + 7) / 8));

    new_image = new Fl_Bitmap(new_array, W, H);
    new_image->alloc_array = 1;

    return new_image;
  }
  if (W <= 0 || H <= 0) return 0;

  // OK, need to resize the image data; allocate memory and 
  uchar		*new_ptr,	// Pointer into new array
		new_bit,	// Bit for new array
		old_bit;	// Bit for old array
  const uchar	*old_ptr;	// Pointer into old array
  int		sx, sy,		// Source coordinates
		dx, dy,		// Destination coordinates
		xerr, yerr,	// X & Y errors
		xmod, ymod,	// X & Y moduli
		xstep, ystep;	// X & Y step increments


  // Figure out Bresenham step/modulus values...
  xmod   = w() % W;
  xstep  = w() / W;
  ymod   = h() % H;
  ystep  = h() / H;

  // Allocate memory for the new image...
  new_array = new uchar [H * ((W + 7) / 8)];
  new_image = new Fl_Bitmap(new_array, W, H);
  new_image->alloc_array = 1;

  memset(new_array, 0, H * ((W + 7) / 8));

  // Scale the image using a nearest-neighbor algorithm...
  for (dy = H, sy = 0, yerr = H, new_ptr = new_array; dy > 0; dy --) {
    for (dx = W, xerr = W, old_ptr = array + sy * ((w() + 7) / 8), sx = 0, new_bit = 1;
	 dx > 0;
	 dx --) {
      old_bit = (uchar)(1 << (sx & 7));
      if (old_ptr[sx / 8] & old_bit) *new_ptr |= new_bit;

      if (new_bit < 128) new_bit <<= 1;
      else {
        new_bit = 1;
	new_ptr ++;
      }

      sx   += xstep;
      xerr -= xmod;

      if (xerr <= 0) {
	xerr += W;
	sx ++;
      }
    }

    if (new_bit > 1) new_ptr ++;

    sy   += ystep;
    yerr -= ymod;
    if (yerr <= 0) {
      yerr += H;
      sy ++;
    }
  }

  return new_image;
}